

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::OneofTest_SerializationToArray_Test::TestBody
          (OneofTest_SerializationToArray_Test *this)

{
  uint8_t *puVar1;
  bool bVar2;
  undefined4 uVar3;
  size_t sVar4;
  uint8_t *puVar5;
  undefined8 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  Arena *pAVar8;
  char *pcVar9;
  char *in_R9;
  pointer *__ptr;
  string_view data_00;
  string_view value;
  string_view data_01;
  string_view value_00;
  string_view data_02;
  string_view data_03;
  string_view data_04;
  string_view data_05;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int size;
  string data;
  TestOneof2 message1;
  TestOneof2 message2;
  AssertHelper local_100;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  AssertHelper local_c8;
  int local_bc;
  uint8_t *local_b8;
  size_t local_b0;
  uint8_t local_a8;
  undefined7 uStack_a7;
  undefined1 local_98 [64];
  TestOneof2 local_58;
  
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)local_98,(Arena *)0x0);
  proto2_unittest::TestOneof2::TestOneof2(&local_58,(Arena *)0x0);
  local_b0 = 0;
  local_a8 = '\0';
  local_b8 = &local_a8;
  if (local_98._56_4_ != 1) {
    proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)local_98);
    local_98._56_4_ = 1;
  }
  local_98._40_4_ = 0x7b;
  sVar4 = proto2_unittest::TestOneof2::ByteSizeLong((TestOneof2 *)local_98);
  local_bc = (int)sVar4;
  std::__cxx11::string::resize((ulong)&local_b8,(char)sVar4);
  puVar1 = local_b8;
  puVar5 = MessageLite::SerializeWithCachedSizesToArray((MessageLite *)local_98,local_b8);
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (puVar5 + -(long)puVar1);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_e8,"size","end - start",&local_bc,(long *)&local_f8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar9 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x71a,pcVar9);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  data_00._M_str = (char *)local_b8;
  data_00._M_len = local_b0;
  bVar2 = MessageLite::ParseFromString((MessageLite *)&local_58,data_00);
  local_f8._M_head_impl._0_1_ = bVar2;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)&local_f8,
               (AssertionResult *)"message2.ParseFromString(data)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x71b,(char *)CONCAT71(local_e8._1_7_,local_e8[0]));
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_e8._1_7_,local_e8[0]) != &local_d8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_e8._1_7_,local_e8[0]),local_d8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_100.data_._4_4_,local_100.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_100.data_._4_4_,local_100.data_._0_4_) + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  uVar3 = 0;
  if (local_58.field_0._impl_._oneof_case_[0] == 1) {
    uVar3 = local_58.field_0._24_4_;
  }
  local_f8._M_head_impl._0_4_ = uVar3;
  local_100.data_._0_4_ = 0x7b;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"message2.foo_int()","123",(int *)&local_f8,(int *)&local_100);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar9 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x71c,pcVar9);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  proto2_unittest::TestOneof2::~TestOneof2(&local_58);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)local_98);
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)local_98,(Arena *)0x0);
  proto2_unittest::TestOneof2::TestOneof2(&local_58,(Arena *)0x0);
  local_b0 = 0;
  local_a8 = '\0';
  local_b8 = &local_a8;
  if (local_98._56_4_ != 2) {
    proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)local_98);
    local_98._56_4_ = 2;
    local_98._40_8_ = &protobuf::internal::fixed_address_empty_string;
  }
  pAVar8 = (Arena *)local_98._8_8_;
  if ((local_98._8_8_ & 1) != 0) {
    pAVar8 = *(Arena **)(local_98._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "foo";
  value._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(local_98 + 0x28),value,pAVar8);
  sVar4 = proto2_unittest::TestOneof2::ByteSizeLong((TestOneof2 *)local_98);
  local_bc = (int)sVar4;
  std::__cxx11::string::resize((ulong)&local_b8,(char)sVar4);
  puVar1 = local_b8;
  puVar5 = MessageLite::SerializeWithCachedSizesToArray((MessageLite *)local_98,local_b8);
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (puVar5 + -(long)puVar1);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_e8,"size","end - start",&local_bc,(long *)&local_f8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar9 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x728,pcVar9);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  data_01._M_str = (char *)local_b8;
  data_01._M_len = local_b0;
  bVar2 = MessageLite::ParseFromString((MessageLite *)&local_58,data_01);
  local_f8._M_head_impl._0_1_ = bVar2;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)&local_f8,
               (AssertionResult *)"message2.ParseFromString(data)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x729,(char *)CONCAT71(local_e8._1_7_,local_e8[0]));
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_e8._1_7_,local_e8[0]) != &local_d8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_e8._1_7_,local_e8[0]),local_d8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_100.data_._4_4_,local_100.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_100.data_._4_4_,local_100.data_._0_4_) + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  if (local_58.field_0._impl_._oneof_case_[0] == 2) {
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT44(local_58.field_0._28_4_,local_58.field_0._24_4_) & 0xfffffffffffffffc);
  }
  else {
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &protobuf::internal::fixed_address_empty_string;
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_e8,"message2.foo_string()","\"foo\"",pbVar7,(char (*) [4])0x11364a4);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar9 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x72a,pcVar9);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  proto2_unittest::TestOneof2::~TestOneof2(&local_58);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)local_98);
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)local_98,(Arena *)0x0);
  proto2_unittest::TestOneof2::TestOneof2(&local_58,(Arena *)0x0);
  local_b0 = 0;
  local_a8 = '\0';
  local_b8 = &local_a8;
  if (local_98._56_4_ != 5) {
    proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)local_98);
    local_98._56_4_ = 5;
    local_98._40_8_ = &protobuf::internal::fixed_address_empty_string;
  }
  pAVar8 = (Arena *)local_98._8_8_;
  if ((local_98._8_8_ & 1) != 0) {
    pAVar8 = *(Arena **)(local_98._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "moo";
  value_00._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(local_98 + 0x28),value_00,pAVar8);
  sVar4 = proto2_unittest::TestOneof2::ByteSizeLong((TestOneof2 *)local_98);
  local_bc = (int)sVar4;
  std::__cxx11::string::resize((ulong)&local_b8,(char)sVar4);
  puVar1 = local_b8;
  puVar5 = MessageLite::SerializeWithCachedSizesToArray((MessageLite *)local_98,local_b8);
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (puVar5 + -(long)puVar1);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_e8,"size","end - start",&local_bc,(long *)&local_f8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar9 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x737,pcVar9);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  data_02._M_str = (char *)local_b8;
  data_02._M_len = local_b0;
  bVar2 = MessageLite::ParseFromString((MessageLite *)&local_58,data_02);
  local_f8._M_head_impl._0_1_ = bVar2;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)&local_f8,
               (AssertionResult *)"message2.ParseFromString(data)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x738,(char *)CONCAT71(local_e8._1_7_,local_e8[0]));
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_e8._1_7_,local_e8[0]) != &local_d8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_e8._1_7_,local_e8[0]),local_d8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_100.data_._4_4_,local_100.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_100.data_._4_4_,local_100.data_._0_4_) + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  if (local_58.field_0._impl_._oneof_case_[0] == 5) {
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT44(local_58.field_0._28_4_,local_58.field_0._24_4_) & 0xfffffffffffffffc);
  }
  else {
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &protobuf::internal::fixed_address_empty_string;
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_e8,"message2.foo_bytes()","\"moo\"",pbVar7,(char (*) [4])0x10c6bdd);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar9 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x739,pcVar9);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  proto2_unittest::TestOneof2::~TestOneof2(&local_58);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)local_98);
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)local_98,(Arena *)0x0);
  proto2_unittest::TestOneof2::TestOneof2(&local_58,(Arena *)0x0);
  local_b0 = 0;
  local_a8 = '\0';
  local_b8 = &local_a8;
  bVar2 = protobuf::internal::ValidateEnum
                    (1,(uint32_t *)&proto2_unittest::TestOneof2_NestedEnum_internal_data_);
  if (bVar2) {
    if (local_98._56_4_ != 6) {
      proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)local_98);
      local_98._56_4_ = 6;
    }
    local_98._40_4_ = 1;
    sVar4 = proto2_unittest::TestOneof2::ByteSizeLong((TestOneof2 *)local_98);
    local_bc = (int)sVar4;
    std::__cxx11::string::resize((ulong)&local_b8,(char)sVar4);
    puVar1 = local_b8;
    puVar5 = MessageLite::SerializeWithCachedSizesToArray((MessageLite *)local_98,local_b8);
    local_f8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (puVar5 + -(long)puVar1);
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)local_e8,"size","end - start",&local_bc,(long *)&local_f8);
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_f8);
      if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar9 = (local_e0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x745,pcVar9);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (local_f8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_f8._M_head_impl + 8))();
      }
    }
    if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e0,local_e0);
    }
    data_03._M_str = (char *)local_b8;
    data_03._M_len = local_b0;
    bVar2 = MessageLite::ParseFromString((MessageLite *)&local_58,data_03);
    local_f8._M_head_impl._0_1_ = bVar2;
    local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_100);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e8,(internal *)&local_f8,
                 (AssertionResult *)"message2.ParseFromString(data)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x746,(char *)CONCAT71(local_e8._1_7_,local_e8[0]));
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_e8._1_7_,local_e8[0]) != &local_d8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_e8._1_7_,local_e8[0]),local_d8._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_100.data_._4_4_,local_100.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_100.data_._4_4_,local_100.data_._0_4_) + 8))();
      }
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
    uVar3 = 1;
    if (local_58.field_0._impl_._oneof_case_[0] == 6) {
      uVar3 = local_58.field_0._24_4_;
    }
    local_f8._M_head_impl._0_4_ = uVar3;
    testing::internal::
    CmpHelperEQ<proto2_unittest::TestOneof2_NestedEnum,proto2_unittest::TestOneof2_NestedEnum>
              ((internal *)local_e8,"message2.foo_enum()","::proto2_unittest::TestOneof2::FOO",
               (TestOneof2_NestedEnum *)&local_f8,&proto2_unittest::TestOneof2::FOO);
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_f8);
      if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar9 = (local_e0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x747,pcVar9);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (local_f8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_f8._M_head_impl + 8))();
      }
    }
    if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e0,local_e0);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
    }
    proto2_unittest::TestOneof2::~TestOneof2(&local_58);
    proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)local_98);
    proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)local_98,(Arena *)0x0);
    proto2_unittest::TestOneof2::TestOneof2(&local_58,(Arena *)0x0);
    local_b0 = 0;
    local_a8 = '\0';
    local_b8 = &local_a8;
    if (local_98._56_4_ != 7) {
      proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)local_98);
      local_98._56_4_ = 7;
      pAVar8 = (Arena *)local_98._8_8_;
      if ((local_98._8_8_ & 1) != 0) {
        pAVar8 = *(Arena **)(local_98._8_8_ & 0xfffffffffffffffe);
      }
      local_98._40_8_ = Arena::DefaultConstruct<proto2_unittest::TestOneof2_NestedMessage>(pAVar8);
    }
    (((Message *)(local_98._40_8_ + 0x30))->super_MessageLite)._vptr_MessageLite =
         (_func_int **)0xea;
    *(byte *)&(((Message *)(local_98._40_8_ + 0x10))->super_MessageLite)._vptr_MessageLite =
         *(byte *)&(((Message *)(local_98._40_8_ + 0x10))->super_MessageLite)._vptr_MessageLite | 2;
    sVar4 = proto2_unittest::TestOneof2::ByteSizeLong((TestOneof2 *)local_98);
    local_bc = (int)sVar4;
    std::__cxx11::string::resize((ulong)&local_b8,(char)sVar4);
    puVar1 = local_b8;
    puVar5 = MessageLite::SerializeWithCachedSizesToArray((MessageLite *)local_98,local_b8);
    local_f8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (puVar5 + -(long)puVar1);
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)local_e8,"size","end - start",&local_bc,(long *)&local_f8);
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_f8);
      if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar9 = (local_e0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x753,pcVar9);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (local_f8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_f8._M_head_impl + 8))();
      }
    }
    if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e0,local_e0);
    }
    data_04._M_str = (char *)local_b8;
    data_04._M_len = local_b0;
    bVar2 = MessageLite::ParseFromString((MessageLite *)&local_58,data_04);
    local_f8._M_head_impl._0_1_ = bVar2;
    local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_100);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e8,(internal *)&local_f8,
                 (AssertionResult *)"message2.ParseFromString(data)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x754,(char *)CONCAT71(local_e8._1_7_,local_e8[0]));
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_e8._1_7_,local_e8[0]) != &local_d8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_e8._1_7_,local_e8[0]),local_d8._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_100.data_._4_4_,local_100.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_100.data_._4_4_,local_100.data_._0_4_) + 8))();
      }
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
    if (local_58.field_0._impl_._oneof_case_[0] == 7) {
      puVar6 = (undefined8 *)CONCAT44(local_58.field_0._28_4_,local_58.field_0._24_4_);
    }
    else {
      puVar6 = &proto2_unittest::_TestOneof2_NestedMessage_default_instance_;
    }
    local_f8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar6[6];
    local_100.data_._0_4_ = 0xea;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)local_e8,"message2.foo_message().moo_int()","234",(long *)&local_f8,
               (int *)&local_100);
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_f8);
      if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar9 = (local_e0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x755,pcVar9);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (local_f8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_f8._M_head_impl + 8))();
      }
    }
    if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e0,local_e0);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
    }
    proto2_unittest::TestOneof2::~TestOneof2(&local_58);
    proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)local_98);
    proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)local_98,(Arena *)0x0);
    proto2_unittest::TestOneof2::TestOneof2(&local_58,(Arena *)0x0);
    local_b0 = 0;
    local_a8 = '\0';
    local_b8 = &local_a8;
    if (local_98._56_4_ != 8) {
      proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)local_98);
      local_98._56_4_ = 8;
      if ((local_98._8_8_ & 1) != 0) {
        local_98._8_8_ = *(undefined8 *)(local_98._8_8_ & 0xfffffffffffffffe);
      }
      local_98._40_8_ =
           Arena::DefaultConstruct<proto2_unittest::TestOneof2_FooGroup>((Arena *)local_98._8_8_);
    }
    *(undefined4 *)&(((Message *)(local_98._40_8_ + 0x20))->super_MessageLite)._vptr_MessageLite =
         0x159;
    *(byte *)&(((Message *)(local_98._40_8_ + 0x10))->super_MessageLite)._vptr_MessageLite =
         *(byte *)&(((Message *)(local_98._40_8_ + 0x10))->super_MessageLite)._vptr_MessageLite | 2;
    sVar4 = proto2_unittest::TestOneof2::ByteSizeLong((TestOneof2 *)local_98);
    local_bc = (int)sVar4;
    std::__cxx11::string::resize((ulong)&local_b8,(char)sVar4);
    puVar1 = local_b8;
    puVar5 = MessageLite::SerializeWithCachedSizesToArray((MessageLite *)local_98,local_b8);
    local_f8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (puVar5 + -(long)puVar1);
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)local_e8,"size","end - start",&local_bc,(long *)&local_f8);
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_f8);
      if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar9 = (local_e0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x761,pcVar9);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (local_f8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_f8._M_head_impl + 8))();
      }
    }
    if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e0,local_e0);
    }
    data_05._M_str = (char *)local_b8;
    data_05._M_len = local_b0;
    bVar2 = MessageLite::ParseFromString((MessageLite *)&local_58,data_05);
    local_f8._M_head_impl._0_1_ = bVar2;
    local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_100);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e8,(internal *)&local_f8,
                 (AssertionResult *)"message2.ParseFromString(data)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x762,(char *)CONCAT71(local_e8._1_7_,local_e8[0]));
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_e8._1_7_,local_e8[0]) != &local_d8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_e8._1_7_,local_e8[0]),local_d8._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_100.data_._4_4_,local_100.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_100.data_._4_4_,local_100.data_._0_4_) + 8))();
      }
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
    if (local_58.field_0._impl_._oneof_case_[0] == 8) {
      puVar6 = (undefined8 *)CONCAT44(local_58.field_0._28_4_,local_58.field_0._24_4_);
    }
    else {
      puVar6 = &proto2_unittest::_TestOneof2_FooGroup_default_instance_;
    }
    local_f8._M_head_impl._0_4_ = *(undefined4 *)(puVar6 + 4);
    local_100.data_._0_4_ = 0x159;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_e8,"message2.foogroup().a()","345",(int *)&local_f8,
               (int *)&local_100);
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_f8);
      if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar9 = (local_e0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x763,pcVar9);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (local_f8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_f8._M_head_impl + 8))();
      }
    }
    if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e0,local_e0);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
    }
    proto2_unittest::TestOneof2::~TestOneof2(&local_58);
    proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)local_98);
    return;
  }
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestOneof2_NestedEnum_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest.pb.h"
                ,0xf6a3,
                "void proto2_unittest::TestOneof2::set_foo_enum(::proto2_unittest::TestOneof2_NestedEnum)"
               );
}

Assistant:

TEST_F(OneofTest, SerializationToArray) {
  // Primitive type
  {
    UNITTEST::TestOneof2 message1, message2;
std::string data;
message1.set_foo_int(123);
int size = message1.ByteSizeLong();
data.resize(size);
uint8_t* start = reinterpret_cast<uint8_t*>(&data[0]);
uint8_t* end = message1.SerializeWithCachedSizesToArray(start);
EXPECT_EQ(size, end - start);
EXPECT_TRUE(message2.ParseFromString(data));
EXPECT_EQ(message2.foo_int(), 123);
  }

  // String
  {
    UNITTEST::TestOneof2 message1, message2;
    std::string data;
    message1.set_foo_string("foo");
    int size = message1.ByteSizeLong();
    data.resize(size);
    uint8_t* start = reinterpret_cast<uint8_t*>(&data[0]);
    uint8_t* end = message1.SerializeWithCachedSizesToArray(start);
    EXPECT_EQ(size, end - start);
    EXPECT_TRUE(message2.ParseFromString(data));
    EXPECT_EQ(message2.foo_string(), "foo");
  }


  // Bytes
  {
    UNITTEST::TestOneof2 message1, message2;
    std::string data;
    message1.set_foo_bytes("moo");
    int size = message1.ByteSizeLong();
    data.resize(size);
    uint8_t* start = reinterpret_cast<uint8_t*>(&data[0]);
    uint8_t* end = message1.SerializeWithCachedSizesToArray(start);
    EXPECT_EQ(size, end - start);
    EXPECT_TRUE(message2.ParseFromString(data));
    EXPECT_EQ(message2.foo_bytes(), "moo");
  }

  // Enum
  {
    UNITTEST::TestOneof2 message1, message2;
    std::string data;
    message1.set_foo_enum(UNITTEST::TestOneof2::FOO);
    int size = message1.ByteSizeLong();
    data.resize(size);
    uint8_t* start = reinterpret_cast<uint8_t*>(&data[0]);
    uint8_t* end = message1.SerializeWithCachedSizesToArray(start);
    EXPECT_EQ(size, end - start);
    EXPECT_TRUE(message2.ParseFromString(data));
    EXPECT_EQ(message2.foo_enum(), UNITTEST::TestOneof2::FOO);
  }

  // Message
  {
    UNITTEST::TestOneof2 message1, message2;
    std::string data;
    message1.mutable_foo_message()->set_moo_int(234);
    int size = message1.ByteSizeLong();
    data.resize(size);
    uint8_t* start = reinterpret_cast<uint8_t*>(&data[0]);
    uint8_t* end = message1.SerializeWithCachedSizesToArray(start);
    EXPECT_EQ(size, end - start);
    EXPECT_TRUE(message2.ParseFromString(data));
    EXPECT_EQ(message2.foo_message().moo_int(), 234);
  }

  // Group
  {
    UNITTEST::TestOneof2 message1, message2;
    std::string data;
    message1.mutable_foogroup()->set_a(345);
    int size = message1.ByteSizeLong();
    data.resize(size);
    uint8_t* start = reinterpret_cast<uint8_t*>(&data[0]);
    uint8_t* end = message1.SerializeWithCachedSizesToArray(start);
    EXPECT_EQ(size, end - start);
    EXPECT_TRUE(message2.ParseFromString(data));
    EXPECT_EQ(message2.foogroup().a(), 345);
  }

}